

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  pointer pVVar1;
  HalfedgeElement *in_RSI;
  Mesh *in_RDI;
  Vector3D *v_00;
  Vector3D c;
  double theta;
  Vector3D t;
  Vector3D s;
  Vector3D b;
  Vector3D a;
  Vector3D v;
  Vector3D u;
  Vector3D e20;
  Vector3D e12;
  Vector3D e01;
  Vector3D p2;
  Vector3D p1;
  Vector3D p0;
  Vector3D *in_stack_fffffffffffffc70;
  Vector3D *in_stack_fffffffffffffc78;
  DrawStyle *in_stack_fffffffffffffc80;
  undefined1 local_318 [32];
  double local_2f8;
  _List_node_base *local_2f0;
  Face *in_stack_fffffffffffffd48;
  undefined1 local_228 [40];
  undefined8 local_200;
  undefined1 local_1d8 [40];
  undefined8 local_1b0;
  undefined8 local_160;
  _List_node_base *local_b0;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  Vector3D local_98;
  _List_node_base *local_78;
  _List_node_base *local_70;
  Vector3D local_68;
  _List_node_base *local_40;
  Vector3D local_38;
  HalfedgeElement *local_10;
  
  local_10 = in_RSI;
  get_draw_style(in_RDI,in_RSI);
  DrawStyle::style_halfedge(in_stack_fffffffffffffc80);
  local_40 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc70);
  Vector3D::Vector3D(&local_38,&pVVar1->position);
  local_78 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc70);
  local_70 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc70);
  Vector3D::Vector3D(&local_68,&pVVar1->position);
  local_b0 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc70);
  local_a8 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
  std::_List_const_iterator<CGL::Halfedge>::operator->
            ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffc70);
  local_a0 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
  pVVar1 = std::_List_const_iterator<CGL::Vertex>::operator->
                     ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffc70);
  Vector3D::Vector3D(&local_98,&pVVar1->position);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  local_160 = 0x4000000000000000;
  Vector3D::operator/(in_stack_fffffffffffffc78,(double *)in_stack_fffffffffffffc70);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  local_1b0 = 0x4000000000000000;
  Vector3D::operator/(in_stack_fffffffffffffc78,(double *)in_stack_fffffffffffffc70);
  local_200 = 0x4014000000000000;
  Vector3D::operator/(in_stack_fffffffffffffc78,(double *)in_stack_fffffffffffffc70);
  Vector3D::operator+(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator/(in_stack_fffffffffffffc78,(double *)in_stack_fffffffffffffc70);
  Vector3D::operator+(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator-(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  Vector3D::operator/(in_stack_fffffffffffffc78,(double *)in_stack_fffffffffffffc70);
  local_2f0 = (_List_node_base *)Halfedge::face((Halfedge *)in_RDI);
  std::_List_const_iterator<CGL::Face>::operator->
            ((_List_const_iterator<CGL::Face> *)in_stack_fffffffffffffc70);
  Face::normal(in_stack_fffffffffffffd48);
  cross(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  local_2f8 = 2.6179938779914944;
  cos(2.6179938779914944);
  CGL::operator*((double *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  Vector3D::operator+(in_stack_fffffffffffffc70,(Vector3D *)in_RDI);
  v_00 = (Vector3D *)sin(local_2f8);
  CGL::operator*((double *)in_stack_fffffffffffffc78,v_00);
  Vector3D::operator+(v_00,(Vector3D *)in_RDI);
  glBegin(3);
  glVertex3dv(local_1d8);
  glVertex3dv(local_228);
  glVertex3dv(local_318);
  glEnd();
  get_draw_style(in_RDI,local_10);
  DrawStyle::style_reset((DrawStyle *)0x1306a2);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D p0 = h->vertex()->position;
  const Vector3D p1 = h->next()->vertex()->position;
  const Vector3D p2 = h->next()->next()->vertex()->position;

  const Vector3D e01 = p1-p0;
  const Vector3D e12 = p2-p1;
  const Vector3D e20 = p0-p2;

  const Vector3D u = (e01 - e20) / 2;
  const Vector3D v = (e12 - e01) / 2;

  const Vector3D a = p0 + u / 5;
  const Vector3D b = p1 + v / 5;

  const Vector3D s = (b-a) / 5;
  const Vector3D t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}